

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

int __thiscall
FIX::DataDictionary::addXMLComponentFields
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool componentRequired)

{
  _Alloc_hider _Var1;
  char cVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  ConfigError *pCVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer *__ptr;
  string *pDoc_00;
  undefined7 in_register_00000089;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  DOMNodePtr pComponentFieldNode;
  string name_1;
  string required;
  DOMAttributesPtr attrs_1;
  DOMAttributesPtr attrs_2;
  DOMNodePtr pComponentNode;
  string name;
  DOMAttributesPtr attrs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  string local_120;
  string local_100;
  int local_dc;
  long *local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  DataDictionary *local_b0;
  string *local_a8;
  DataDictionary *local_a0;
  long *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  DOMDocument *local_70;
  undefined4 local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  MsgTypeToField *local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000089,componentRequired);
  local_b0 = this;
  local_a8 = msgtype;
  local_a0 = DD;
  local_70 = pDoc;
  (*pNode->_vptr_DOMNode[4])(&local_40,pNode);
  plVar5 = local_40;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  paVar8 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"name","");
  cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_120,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar8) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (cVar2 == '\0') {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_120._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"No name given to component","");
    ConfigError::ConfigError(pCVar6,&local_120);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  std::operator+(&local_60,"/fix/components/component[@name=\'",&local_90);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_60);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar7) {
    local_120.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_120.field_2._8_4_ = (undefined4)plVar5[3];
    local_120.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_120._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_120.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_120._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_120._M_string_length = plVar5[1];
  *plVar5 = (long)paVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*local_70->_vptr_DOMDocument[5])(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar8) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_98 == (long *)0x0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_120,"Component not found: ",&local_90);
    ConfigError::ConfigError(pCVar6,&local_120);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  (**(code **)(*local_98 + 0x10))(&local_128);
  if (local_128 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_dc = 0;
  }
  else {
    local_38 = &local_b0->m_requiredFields;
    local_dc = 0;
    do {
      (**(code **)(local_128->_M_allocated_capacity + 0x28))(&local_120);
      iVar3 = std::__cxx11::string::compare((char *)&local_120);
      if (iVar3 == 0) {
        bVar9 = true;
      }
      else {
        (**(code **)(local_128->_M_allocated_capacity + 0x28))(&local_60);
        iVar3 = std::__cxx11::string::compare((char *)&local_60);
        bVar9 = iVar3 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        (**(code **)(local_128->_M_allocated_capacity + 0x20))(&local_d8);
        plVar5 = local_d8;
        local_120._M_string_length = 0;
        local_120.field_2._M_allocated_capacity =
             local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"name","");
        pDoc_00 = &local_100;
        cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_100,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          pDoc_00 = (string *)
                    (CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                              local_100.field_2._M_local_buf[0]) + 1);
          operator_delete(local_100._M_dataplus._M_p,(ulong)pDoc_00);
        }
        if (cVar2 == '\0') {
          pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,"No name given to field","");
          ConfigError::ConfigError(pCVar6,&local_100);
          __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
        }
        iVar3 = lookupXMLFieldNumber(local_b0,(DOMDocument *)pDoc_00,&local_120);
        plVar5 = local_d8;
        if (local_dc == 0) {
          local_dc = iVar3;
        }
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        local_100._M_string_length = 0;
        local_100.field_2._M_local_buf[0] = '\0';
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"required","");
        cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,(string *)local_d0,&local_100);
        if ((cVar2 == '\0') ||
           ((iVar4 = std::__cxx11::string::compare((char *)&local_100), iVar4 != 0 &&
            (iVar4 = std::__cxx11::string::compare((char *)&local_100), iVar4 != 0)))) {
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
        }
        else {
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          if ((char)local_64 != '\0') {
            local_d0[0] = (long *)CONCAT44(local_d0[0]._4_4_,iVar3);
            this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](local_38,local_a8);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(this_00,(int *)local_d0);
          }
        }
        addField(local_a0,iVar3);
        addMsgField(local_a0,local_a8,iVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != (long *)0x0) {
          (**(code **)(*local_d8 + 8))();
        }
      }
      paVar8 = &local_120.field_2;
      (**(code **)(local_128->_M_allocated_capacity + 0x28))(&local_120);
      iVar3 = std::__cxx11::string::compare((char *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar8) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        (**(code **)(local_128->_M_allocated_capacity + 0x20))((string *)local_d0);
        plVar5 = local_d0[0];
        local_120._M_string_length = 0;
        local_120.field_2._M_allocated_capacity =
             local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        local_120._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"required","");
        (**(code **)(*plVar5 + 0x10))(plVar5,&local_100,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_120);
        if (iVar3 == 0) {
          bVar9 = true;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_120);
          bVar9 = iVar3 == 0;
        }
        addXMLComponentFields
                  (local_b0,local_70,(DOMNode *)&local_128->_M_allocated_capacity,local_a8,local_a0,
                   bVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar8) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_d0[0] != (long *)0x0) {
          (**(code **)(*local_d0[0] + 8))();
        }
      }
      (**(code **)(local_128->_M_allocated_capacity + 0x28))(&local_120);
      iVar3 = std::__cxx11::string::compare((char *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar8) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        (**(code **)(local_128->_M_allocated_capacity + 0x20))((string *)local_d0);
        plVar5 = local_d0[0];
        local_120._M_string_length = 0;
        local_120.field_2._M_allocated_capacity =
             local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        local_120._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"required","");
        (**(code **)(*plVar5 + 0x10))(plVar5,&local_100,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_120);
        if (iVar3 == 0) {
          bVar9 = true;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_120);
          bVar9 = iVar3 == 0;
        }
        addXMLGroup(local_b0,local_70,(DOMNode *)&local_128->_M_allocated_capacity,local_a8,local_a0
                    ,bVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar8) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_d0[0] != (long *)0x0) {
          (**(code **)(*local_d0[0] + 8))();
        }
      }
      (**(code **)(local_128->_M_allocated_capacity + 0x18))(&local_120);
      _Var1._M_p = local_120._M_dataplus._M_p;
      paVar8 = local_128;
      local_120._M_dataplus._M_p = (pointer)0x0;
      local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var1._M_p;
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        (**(code **)(paVar8->_M_allocated_capacity + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_120._M_dataplus._M_p + 8))();
      }
    } while (local_128 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  if (local_98 != (long *)0x0) {
    (**(code **)(*local_98 + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  return local_dc;
}

Assistant:

int DataDictionary::addXMLComponentFields(
    DOMDocument *pDoc,
    DOMNode *pNode,
    const std::string &msgtype,
    DataDictionary &DD,
    bool componentRequired) {
  int firstField = 0;

  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to component");
  }

  DOMNodePtr pComponentNode = pDoc->getNode("/fix/components/component[@name='" + name + "']");
  if (pComponentNode.get() == 0) {
    throw ConfigError("Component not found: " + name);
  }

  DOMNodePtr pComponentFieldNode = pComponentNode->getFirstChildNode();
  while (pComponentFieldNode.get()) {
    if (pComponentFieldNode->getName() == "field" || pComponentFieldNode->getName() == "group") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string name;
      if (!attrs->get("name", name)) {
        throw ConfigError("No name given to field");
      }
      int field = lookupXMLFieldNumber(pDoc, name);
      if (firstField == 0) {
        firstField = field;
      }

      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && componentRequired) {
        addRequiredField(msgtype, field);
      }

      DD.addField(field);
      DD.addMsgField(msgtype, field);
    }
    if (pComponentFieldNode->getName() == "component") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string required;
      attrs->get("required", required);
      bool isRequired = (required == "Y" || required == "y");
      addXMLComponentFields(pDoc, pComponentFieldNode.get(), msgtype, DD, isRequired);
    }
    if (pComponentFieldNode->getName() == "group") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string required;
      attrs->get("required", required);
      bool isRequired = (required == "Y" || required == "y");
      addXMLGroup(pDoc, pComponentFieldNode.get(), msgtype, DD, isRequired);
    }
    RESET_AUTO_PTR(pComponentFieldNode, pComponentFieldNode->getNextSiblingNode());
  }
  return firstField;
}